

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall libtorrent::session::session(session *this)

{
  undefined1 local_1d8 [8];
  session_params params;
  session *this_local;
  
  params.dht_settings._56_8_ = this;
  session_handle::session_handle(&this->super_session_handle);
  ::std::shared_ptr<boost::asio::io_context>::shared_ptr(&this->m_io_service);
  ::std::shared_ptr<std::thread>::shared_ptr(&this->m_thread);
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr(&this->m_impl);
  session_params::session_params((session_params *)local_1d8);
  start(this,params.settings.m_bools.
             super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_,(session_params *)local_1d8,
        (io_context *)0x0);
  session_params::~session_params((session_params *)local_1d8);
  return;
}

Assistant:

session::session()
	{
		session_params params;
		start(params.flags, std::move(params), nullptr);
	}